

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O3

int Mpm_CutAlloc(Mpm_Man_t *p,int nLeaves,Mpm_Cut_t **ppCut)

{
  undefined1 *puVar1;
  Mpm_Cut_t *pMVar2;
  size_t __size;
  undefined4 uVar3;
  Mmr_Step_t *pMVar4;
  long lVar5;
  int iVar6;
  void *__s;
  void *pvVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  
  pMVar4 = p->pManCuts;
  uVar15 = nLeaves * 4 + 0xcU >> 3;
  if (pMVar4->uMask < (int)uVar15) {
    __assert_fail("nWords > 0 && nWords <= p->uMask",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mem/mem2.h"
                  ,0xf3,"int Mmr_StepFetch(Mmr_Step_t *, int)");
  }
  iVar6 = pMVar4->nEntries + 1;
  pMVar4->nEntries = iVar6;
  pMVar4->nEntriesAll = pMVar4->nEntriesAll + 1;
  if (iVar6 < pMVar4->nEntriesMax) {
    iVar6 = pMVar4->nEntriesMax;
  }
  pMVar4->nEntriesMax = iVar6;
  lVar16 = (ulong)uVar15 * 0x38;
  iVar6 = *(int *)((long)pMVar4 + lVar16 + 0x44);
  if (iVar6 == 0) {
    uVar11 = *(uint *)((long)pMVar4 + lVar16 + 0x34);
    bVar8 = *(byte *)((long)pMVar4 + lVar16 + 0x18);
    __size = (long)*(int *)((long)pMVar4 + lVar16 + 0x1c) * 8 + 8;
    __s = malloc(__size);
    memset(__s,0xff,__size);
    if (uVar11 == *(uint *)((long)pMVar4 + lVar16 + 0x30)) {
      if ((int)uVar11 < 0x10) {
        pvVar7 = *(void **)((long)pMVar4 + lVar16 + 0x38);
        if (pvVar7 == (void *)0x0) {
          pvVar7 = malloc(0x80);
        }
        else {
          pvVar7 = realloc(pvVar7,0x80);
        }
        *(void **)((long)pMVar4 + lVar16 + 0x38) = pvVar7;
        *(undefined4 *)((long)pMVar4 + lVar16 + 0x30) = 0x10;
      }
      else {
        pvVar7 = *(void **)((long)pMVar4 + lVar16 + 0x38);
        if (pvVar7 == (void *)0x0) {
          pvVar7 = malloc((ulong)uVar11 << 4);
        }
        else {
          pvVar7 = realloc(pvVar7,(ulong)uVar11 << 4);
        }
        *(void **)((long)pMVar4 + lVar16 + 0x38) = pvVar7;
        *(uint *)((long)pMVar4 + lVar16 + 0x30) = uVar11 * 2;
      }
    }
    else {
      pvVar7 = *(void **)((long)pMVar4 + lVar16 + 0x38);
    }
    iVar6 = *(int *)((long)pMVar4 + lVar16 + 0x34);
    *(int *)((long)pMVar4 + lVar16 + 0x34) = iVar6 + 1;
    *(void **)((long)pvVar7 + (long)iVar6 * 8) = __s;
    if (*(int *)((long)pMVar4 + lVar16 + 0x20) < *(int *)((long)pMVar4 + lVar16 + 0x1c)) {
      uVar10 = 1;
      do {
        Vec_IntPush((Vec_Int_t *)((long)pMVar4 + lVar16 + 0x40),uVar10 | uVar11 << (bVar8 & 0x1f));
        iVar6 = *(int *)((long)pMVar4 + lVar16 + 0x20);
        uVar10 = uVar10 + iVar6;
      } while ((int)(iVar6 + uVar10) <= *(int *)((long)pMVar4 + lVar16 + 0x1c));
    }
    iVar6 = *(int *)((long)pMVar4 + lVar16 + 0x44);
    if (1 < iVar6) {
      lVar5 = *(long *)((long)pMVar4 + lVar16 + 0x48);
      iVar12 = -1;
      lVar14 = 0;
      do {
        uVar3 = *(undefined4 *)(lVar5 + lVar14 * 4);
        *(undefined4 *)(lVar5 + lVar14 * 4) = *(undefined4 *)(lVar5 + (long)(iVar6 + iVar12) * 4);
        *(undefined4 *)(lVar5 + (long)(*(int *)((long)pMVar4 + lVar16 + 0x44) + iVar12) * 4) = uVar3
        ;
        lVar14 = lVar14 + 1;
        iVar6 = *(int *)((long)pMVar4 + lVar16 + 0x44);
        iVar12 = iVar12 + -1;
      } while (lVar14 < iVar6 / 2);
    }
  }
  iVar12 = *(int *)((long)pMVar4 + lVar16 + 0x28);
  iVar9 = *(int *)((long)pMVar4 + lVar16 + 0x24) + 1;
  *(int *)((long)pMVar4 + lVar16 + 0x24) = iVar9;
  if (iVar9 < iVar12) {
    iVar9 = iVar12;
  }
  *(int *)((long)pMVar4 + lVar16 + 0x28) = iVar9;
  if (iVar6 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
  }
  *(uint *)((long)pMVar4 + lVar16 + 0x44) = iVar6 - 1U;
  uVar15 = *(int *)(*(long *)((long)pMVar4 + lVar16 + 0x48) + (ulong)(iVar6 - 1U) * 4) <<
           ((byte)pMVar4->nBits & 0x1f) | uVar15;
  pMVar4 = p->pManCuts;
  uVar11 = pMVar4->uMask & uVar15;
  if ((int)uVar11 < 1) {
    __assert_fail("(h & p->uMask) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mem/mem2.h"
                  ,0xee,"word *Mmr_StepEntry(Mmr_Step_t *, int)");
  }
  uVar10 = (int)uVar15 >> ((byte)pMVar4->nBits & 0x1f);
  if (0 < (int)uVar10) {
    iVar6 = *(int *)((long)pMVar4 + (ulong)uVar11 * 0x38 + 0x34);
    bVar8 = (byte)*(undefined4 *)((long)pMVar4 + (ulong)uVar11 * 0x38 + 0x18);
    if ((int)uVar10 < iVar6 << (bVar8 & 0x1f)) {
      uVar13 = uVar10 >> (bVar8 & 0x1f);
      if (iVar6 <= (int)uVar13) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pMVar2 = (Mpm_Cut_t *)
               (*(long *)(*(long *)((long)pMVar4 + (ulong)uVar11 * 0x38 + 0x38) + (ulong)uVar13 * 8)
               + (ulong)(uVar10 & *(uint *)((long)pMVar4 + (ulong)uVar11 * 0x38 + 0x1c)) * 8);
      *ppCut = pMVar2;
      *(uint *)&pMVar2->field_0x4 = *(uint *)&pMVar2->field_0x4 & 0x7ffffff | nLeaves << 0x1b;
      pMVar2 = *ppCut;
      pMVar2->hNext = 0;
      puVar1 = &pMVar2->field_0x7;
      *puVar1 = *puVar1 & 0xfb;
      *(uint *)&(*ppCut)->field_0x4 = *(uint *)&(*ppCut)->field_0x4 & 0xfdffffff;
      return uVar15;
    }
  }
  __assert_fail("h > 0 && h < (Vec_PtrSize(&p->vPages) << p->nPageBase)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mem/mem2.h"
                ,0xb2,"word *Mmr_FixedEntry(Mmr_Fixed_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

//#define MIG_RUNTIME

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Cut manipulation.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
static inline int Mpm_CutAlloc( Mpm_Man_t * p, int nLeaves, Mpm_Cut_t ** ppCut )  
{ 
    int hHandle = Mmr_StepFetch( p->pManCuts, Mpm_CutWordNum(nLeaves) );
    *ppCut      = (Mpm_Cut_t *)Mmr_StepEntry( p->pManCuts, hHandle );
    (*ppCut)->nLeaves  = nLeaves;
    (*ppCut)->hNext    = 0;
    (*ppCut)->fUseless = 0;
    (*ppCut)->fCompl   = 0;
    return hHandle;
}